

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O0

void __thiscall
tt::net::EventLoop::updatePoller(EventLoop *this,shared_ptr<tt::net::Channel> *channel,int timeout)

{
  element_type *this_00;
  shared_ptr<tt::net::Channel> local_30;
  int local_1c;
  shared_ptr<tt::net::Channel> *psStack_18;
  int timeout_local;
  shared_ptr<tt::net::Channel> *channel_local;
  EventLoop *this_local;
  
  local_1c = timeout;
  psStack_18 = channel;
  channel_local = (shared_ptr<tt::net::Channel> *)this;
  this_00 = std::__shared_ptr_access<tt::net::Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<tt::net::Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_epoll);
  std::shared_ptr<tt::net::Channel>::shared_ptr(&local_30,channel);
  Epoll::epoll_mod(this_00,&local_30,local_1c);
  std::shared_ptr<tt::net::Channel>::~shared_ptr(&local_30);
  return;
}

Assistant:

void EventLoop::updatePoller(std::shared_ptr<Channel> channel, int timeout){ 
		m_epoll->epoll_mod(channel, timeout); 
}